

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hxx
# Opt level: O2

void __thiscall
FileParse::Child<const_std::optional<BSDFData::Geometry>_>::Child
          (Child<const_std::optional<BSDFData::Geometry>_> *this,string *nodeName,
          optional<BSDFData::Geometry> *data,size_t index)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,nodeName);
  __l._M_len = 1;
  __l._M_array = &local_40;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->nodeNames,__l,&local_41);
  std::__cxx11::string::~string((string *)&local_40);
  this->data = data;
  this->index = index;
  return;
}

Assistant:

Child(const std::string & nodeName, T & data, size_t index = 0u) :
            nodeNames({nodeName}), data(data), index(index)
        {}